

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

TVector2<double> __thiscall
TVector2<double>::Rotated<double>(TVector2<double> *this,TAngle<double> *angle)

{
  double dVar1;
  double dVar2;
  double *in_RDX;
  double dVar3;
  double dVar4;
  TVector2<double> TVar5;
  
  dVar3 = FFastTrig::cos(&fasttrig,*in_RDX * 11930464.711111112 + 6755399441055744.0);
  dVar4 = FFastTrig::sin(&fasttrig,*in_RDX * 11930464.711111112 + 6755399441055744.0);
  dVar1 = angle->Degrees;
  dVar2 = angle[1].Degrees;
  TVar5.X = dVar3 * dVar1 - dVar2 * dVar4;
  this->X = TVar5.X;
  this->Y = dVar1 * dVar4 + dVar3 * dVar2;
  TVar5.Y = TVar5.X;
  return TVar5;
}

Assistant:

TVector2 Rotated(TAngle<T> angle)
	{
		double cosval = angle.Cos();
		double sinval = angle.Sin();
		return TVector2(X*cosval - Y*sinval, Y*cosval + X*sinval);
	}